

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  ushort *puVar2;
  uint uVar3;
  
  uVar3 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  if ((Insn & 0x40) == 0) {
    puVar2 = DPRDecoderTable + uVar3;
  }
  else {
    if ((Insn >> 0xc & 1) != 0) {
      return MCDisassembler_Fail;
    }
    puVar2 = (ushort *)((long)QPRDecoderTable + (ulong)uVar3);
  }
  MCOperand_CreateReg0(Inst,(uint)*puVar2);
  MCOperand_CreateImm0
            (Inst,(ulong)(Insn & 0xf0f | Insn >> 0xc & 0x70 | Insn >> 0x11 & 0x80 |
                         (Insn & 0x20) << 7));
  uVar1 = MCInst_getOpcode(Inst);
  if ((int)uVar1 < 0x5a2) {
    if (uVar1 - 599 < 2) {
LAB_0014f699:
      puVar2 = DPRDecoderTable + uVar3;
      goto LAB_0014f6bc;
    }
    if (1 < uVar1 - 0x259) {
      return MCDisassembler_Success;
    }
  }
  else if (1 < uVar1 - 0x5a4) {
    if (1 < uVar1 - 0x5a2) {
      return MCDisassembler_Success;
    }
    goto LAB_0014f699;
  }
  if ((Insn >> 0xc & 1) != 0) {
    return MCDisassembler_Fail;
  }
  puVar2 = (ushort *)((long)QPRDecoderTable + (ulong)uVar3);
LAB_0014f6bc:
  MCOperand_CreateReg0(Inst,(uint)*puVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned imm, Q;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	imm = fieldFromInstruction_4(Insn, 0, 4);
	imm |= fieldFromInstruction_4(Insn, 16, 3) << 4;
	imm |= fieldFromInstruction_4(Insn, 24, 1) << 7;
	imm |= fieldFromInstruction_4(Insn, 8, 4) << 8;
	imm |= fieldFromInstruction_4(Insn, 5, 1) << 12;
	Q = fieldFromInstruction_4(Insn, 6, 1);

	if (Q) {
		if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	} else {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	MCOperand_CreateImm0(Inst, imm);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VORRiv4i16:
		case ARM_VORRiv2i32:
		case ARM_VBICiv4i16:
		case ARM_VBICiv2i32:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VORRiv8i16:
		case ARM_VORRiv4i32:
		case ARM_VBICiv8i16:
		case ARM_VBICiv4i32:
			if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}